

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_line_to(plutovg_path_t *path,float x,float y)

{
  plutovg_path_element_t pVar1;
  plutovg_path_element_t *ppVar2;
  plutovg_path_element_t *elements;
  float y_local;
  float x_local;
  plutovg_path_t *path_local;
  
  if ((path->elements).size == 0) {
    plutovg_path_move_to(path,0.0,0.0);
  }
  ppVar2 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_LINE_TO,1);
  pVar1.point.y = y;
  pVar1.point.x = x;
  *ppVar2 = pVar1;
  return;
}

Assistant:

void plutovg_path_line_to(plutovg_path_t* path, float x, float y)
{
    if(path->elements.size == 0)
        plutovg_path_move_to(path, 0, 0);
    plutovg_path_element_t* elements = plutovg_path_add_command(path, PLUTOVG_PATH_COMMAND_LINE_TO, 1);
    elements[0].point = PLUTOVG_MAKE_POINT(x, y);
}